

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonobject.cpp
# Opt level: O1

iterator __thiscall
QJsonObject::insertImpl<QStringView>(QJsonObject *this,QStringView key,QJsonValue *value)

{
  QCborContainerPrivate *pQVar1;
  Type TVar2;
  qsizetype pos;
  ulong uVar3;
  long in_FS_OFFSET;
  iterator iVar4;
  bool keyExists;
  bool local_29;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  TVar2 = QJsonValue::type(value);
  if (TVar2 == Undefined) {
    removeImpl<QStringView>(this,key);
    detach(this,0);
    pQVar1 = (this->o).d.ptr;
    if (pQVar1 == (QCborContainerPrivate *)0x0) {
      uVar3 = 1;
    }
    else {
      uVar3 = (pQVar1->elements).d.size | 1;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      iVar4.item.super_QJsonValueConstRef._8_8_ = uVar3;
      iVar4.item.super_QJsonValueConstRef.d = pQVar1;
      return (iterator)iVar4.item.super_QJsonValueConstRef;
    }
  }
  else {
    local_29 = false;
    if ((this->o).d.ptr == (QCborContainerPrivate *)0x0) {
      pos = 0;
    }
    else {
      pos = indexOf<QStringView>(&this->o,key,&local_29);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
      iVar4 = insertAt<QStringView>(this,pos,key,value,local_29);
      return (QJsonValueRef)(QJsonValueRef)iVar4;
    }
  }
  __stack_chk_fail();
}

Assistant:

QJsonObject::iterator QJsonObject::insertImpl(T key, const QJsonValue &value)
{
    if (value.type() == QJsonValue::Undefined) {
        remove(key);
        return end();
    }
    bool keyExists = false;
    auto pos = o ? indexOf(o, key, &keyExists) : 0;
    return insertAt(pos, key, value, keyExists);
}